

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JavascriptString.cpp
# Opt level: O1

Var Js::JavascriptString::EntryFromCharCode(RecyclableObject *function,CallInfo callInfo,...)

{
  ScriptContext *pSVar1;
  void *pvVar2;
  code *pcVar3;
  int iVar4;
  bool bVar5;
  uint16 uVar6;
  undefined4 *puVar7;
  Var pvVar8;
  JavascriptString *pJVar9;
  charcount_t length;
  long lVar10;
  int in_stack_00000010;
  CallInfo local_60;
  CallInfo callInfo_local;
  ArgumentReader args;
  BufferStringBuilder builder;
  
  pSVar1 = (((((function->type).ptr)->javascriptLibrary).ptr)->super_JavascriptLibraryBase).
           scriptContext.ptr;
  local_60 = callInfo;
  ThreadContext::ProbeStack(pSVar1->threadContext,0xc00,pSVar1,(PVOID)0x0);
  if (in_stack_00000010 != local_60._0_4_) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar7 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    *puVar7 = 1;
    bVar5 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Library/JavascriptString.cpp"
                                ,0x3be,
                                "(*reinterpret_cast<Js::CallInfo*>(_argsVarArray - 1) == callInfo)",
                                "*reinterpret_cast<Js::CallInfo*>(_argsVarArray - 1) == callInfo");
    if (!bVar5) goto LAB_00d22bf7;
    *puVar7 = 0;
  }
  args.super_Arguments.Info = (Type)&stack0x00000018;
  callInfo_local = local_60;
  ArgumentReader::AdjustArguments((ArgumentReader *)&callInfo_local,&local_60);
  pSVar1 = (((((function->type).ptr)->javascriptLibrary).ptr)->super_JavascriptLibraryBase).
           scriptContext.ptr;
  if (((ulong)local_60 & 0x1000000) != 0) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar7 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    *puVar7 = 1;
    bVar5 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Library/JavascriptString.cpp"
                                ,0x3c1,"(!(callInfo.Flags & CallFlags_New))",
                                "!(callInfo.Flags & CallFlags_New)");
    if (!bVar5) goto LAB_00d22bf7;
    *puVar7 = 0;
  }
  if (((ulong)callInfo_local & 0xffffff) == 0) {
    JavascriptError::ThrowTypeError(pSVar1,-0x7ff5ec3f,L"String.fromCharCode");
  }
  length = (callInfo_local._0_4_ & 0xffffff) - 1;
  if (length == 1) {
    pvVar8 = Arguments::operator[]((Arguments *)&callInfo_local,1);
    if (((ulong)pvVar8 & 0x1ffff00000000) != 0x1000000000000 &&
        ((ulong)pvVar8 & 0xffff000000000000) == 0x1000000000000) {
      AssertCount = AssertCount + 1;
      Throw::LogAssert();
      puVar7 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
      *puVar7 = 1;
      bVar5 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/./Language/TaggedInt.inl"
                                  ,0x2a,"((uintptr_t)aValue >> 32 == (AtomTag << 16))",
                                  "(uintptr_t)aValue >> 32 == (AtomTag << 16)");
      if (!bVar5) goto LAB_00d22bf7;
      *puVar7 = 0;
    }
    if (((ulong)pvVar8 & 0xffff000000000000) == 0x1000000000000) {
      if (((ulong)pvVar8 & 0x1ffff00000000) != 0x1000000000000) {
        AssertCount = AssertCount + 1;
        Throw::LogAssert();
        puVar7 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
        *puVar7 = 1;
        bVar5 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/./Language/TaggedInt.inl"
                                    ,0x2a,"((uintptr_t)aValue >> 32 == (AtomTag << 16))",
                                    "(uintptr_t)aValue >> 32 == (AtomTag << 16)");
        if (!bVar5) {
LAB_00d22bf7:
          pcVar3 = (code *)invalidInstructionException();
          (*pcVar3)();
        }
        *puVar7 = 0;
      }
    }
    else {
      uVar6 = JavascriptConversion::ToUInt16_Full(pvVar8,pSVar1);
      pvVar8 = (Var)(ulong)uVar6;
    }
    pJVar9 = CharStringCache::GetStringForChar
                       (&((pSVar1->super_ScriptContextBase).javascriptLibrary)->charStringCache,
                        (char16)pvVar8);
  }
  else {
    args.super_Arguments.Values = (Type)BufferStringBuilder::WritableString::New(length,pSVar1);
    BufferStringBuilder::DbgAssertNotFrozen((BufferStringBuilder *)&args.super_Arguments.Values);
    if (((ulong)callInfo_local & 0xfffffe) != 0) {
      pvVar2 = args.super_Arguments.Values[2];
      puVar7 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
      lVar10 = 0;
      do {
        iVar4 = (int)lVar10;
        pvVar8 = Arguments::operator[]((Arguments *)&callInfo_local,iVar4 + 1);
        if (((ulong)pvVar8 & 0x1ffff00000000) != 0x1000000000000 &&
            ((ulong)pvVar8 & 0xffff000000000000) == 0x1000000000000) {
          AssertCount = AssertCount + 1;
          Throw::LogAssert();
          *puVar7 = 1;
          bVar5 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/./Language/TaggedInt.inl"
                                      ,0x2a,"((uintptr_t)aValue >> 32 == (AtomTag << 16))",
                                      "(uintptr_t)aValue >> 32 == (AtomTag << 16)");
          if (!bVar5) goto LAB_00d22bf7;
          *puVar7 = 0;
        }
        if (((ulong)pvVar8 & 0xffff000000000000) == 0x1000000000000) {
          if (((ulong)pvVar8 & 0x1ffff00000000) != 0x1000000000000) {
            AssertCount = AssertCount + 1;
            Throw::LogAssert();
            *puVar7 = 1;
            bVar5 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/./Language/TaggedInt.inl"
                                        ,0x2a,"((uintptr_t)aValue >> 32 == (AtomTag << 16))",
                                        "(uintptr_t)aValue >> 32 == (AtomTag << 16)");
            if (!bVar5) goto LAB_00d22bf7;
            *puVar7 = 0;
          }
        }
        else {
          uVar6 = JavascriptConversion::ToUInt16_Full(pvVar8,pSVar1);
          pvVar8 = (Var)(ulong)uVar6;
        }
        *(short *)((long)pvVar2 + lVar10 * 2) = (short)pvVar8;
        lVar10 = lVar10 + 1;
      } while (iVar4 + 2U < (callInfo_local._0_4_ & 0xffffff));
    }
    pJVar9 = BufferStringBuilder::ToString((BufferStringBuilder *)&args.super_Arguments.Values);
  }
  return pJVar9;
}

Assistant:

Var JavascriptString::EntryFromCharCode(RecyclableObject* function, CallInfo callInfo, ...)
    {
        PROBE_STACK(function->GetScriptContext(), Js::Constants::MinStackDefault);

        ARGUMENTS(args, callInfo);
        ScriptContext* scriptContext = function->GetScriptContext();

        Assert(!(callInfo.Flags & CallFlags_New));

        //
        // Construct a new string instance to contain all of the explicit parameters:
        // - Don't include the 'this' parameter.
        //
        if(args.Info.Count == 0)
        {
            JavascriptError::ThrowTypeError(scriptContext, JSERR_This_NeedString, _u("String.fromCharCode"));
        }
        AssertMsg(args.Info.Count > 0, "Negative argument count");

        int charLength = args.Info.Count - 1;

        // Special case for single char
        if( charLength == 1 )
        {
            char16 ch = JavascriptConversion::ToUInt16(args[1], scriptContext);
            return scriptContext->GetLibrary()->GetCharStringCache().GetStringForChar(ch);
        }

        BufferStringBuilder builder(charLength,scriptContext);
        char16 * stringBuffer = builder.DangerousGetWritableBuffer();

        //
        // Call ToUInt16 for each parameter, storing the character at the appropriate position.
        //

        for (uint idxArg = 1; idxArg < args.Info.Count; idxArg++)
        {
            *stringBuffer++ = JavascriptConversion::ToUInt16(args[idxArg], scriptContext);
        }

        //
        // Return the new string instance.
        //
        return builder.ToString();
    }